

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.c
# Opt level: O2

unsigned_long_long XXH64_digest(XXH64_state_t *state_in)

{
  ulong uVar1;
  ulong uVar2;
  uint *puVar3;
  uint *puVar4;
  long lVar5;
  ulong uVar6;
  
  if ((ulong)state_in->ll[0] < 0x20) {
    lVar5 = state_in->ll[1] + 0x27d4eb2f165667c5;
  }
  else {
    lVar5 = state_in->ll[2];
    uVar6 = state_in->ll[3];
    uVar1 = state_in->ll[4];
    uVar2 = state_in->ll[5];
    lVar5 = ((uVar2 * -0x3d4d51c2d82b14b1 >> 0x21 | uVar2 * -0x6c158a5880000000) *
             -0x61c8864e7a143579 ^
            ((uVar1 * -0x3d4d51c2d82b14b1 >> 0x21 | uVar1 * -0x6c158a5880000000) *
             -0x61c8864e7a143579 ^
            ((uVar6 * -0x3d4d51c2d82b14b1 >> 0x21 | uVar6 * -0x6c158a5880000000) *
             -0x61c8864e7a143579 ^
            (((ulong)(lVar5 * -0x3d4d51c2d82b14b1) >> 0x21 | lVar5 * -0x6c158a5880000000) *
             -0x61c8864e7a143579 ^
            (uVar2 << 0x12 | uVar2 >> 0x2e) + (uVar1 << 0xc | uVar1 >> 0x34) +
            (uVar6 << 7 | uVar6 >> 0x39) + (lVar5 << 1 | (ulong)(lVar5 < 0))) * -0x61c8864e7a143579
            + 0x85ebca77c2b2ae63) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63) * -0x61c8864e7a143579
            + 0x85ebca77c2b2ae63) * -0x61c8864e7a143579 + -0x7a1435883d4d519d;
  }
  puVar4 = (uint *)((long)state_in->ll + (ulong)(uint)state_in->ll[6] + 0x34);
  uVar6 = lVar5 + state_in->ll[0];
  puVar3 = (uint *)((long)state_in->ll + 0x34);
  while (puVar3 + 2 <= puVar4) {
    uVar6 = ((ulong)(*(long *)puVar3 * -0x3d4d51c2d82b14b1) >> 0x21 |
            *(long *)puVar3 * -0x6c158a5880000000) * -0x61c8864e7a143579 ^ uVar6;
    uVar6 = (uVar6 << 0x1b | uVar6 >> 0x25) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
    puVar3 = puVar3 + 2;
  }
  if (puVar3 + 1 <= puVar4) {
    uVar6 = (ulong)*puVar3 * -0x61c8864e7a143579 ^ uVar6;
    uVar6 = (uVar6 << 0x17 | uVar6 >> 0x29) * -0x3d4d51c2d82b14b1 + 0x165667b19e3779f9;
    puVar3 = puVar3 + 1;
  }
  for (; puVar3 < puVar4; puVar3 = (uint *)((long)puVar3 + 1)) {
    uVar6 = (ulong)(byte)*puVar3 * 0x27d4eb2f165667c5 ^ uVar6;
    uVar6 = (uVar6 << 0xb | uVar6 >> 0x35) * -0x61c8864e7a143579;
  }
  uVar6 = (uVar6 >> 0x21 ^ uVar6) * -0x3d4d51c2d82b14b1;
  uVar6 = (uVar6 >> 0x1d ^ uVar6) * 0x165667b19e3779f9;
  return uVar6 >> 0x20 ^ uVar6;
}

Assistant:

unsigned long long XXH64_digest(const XXH64_state_t *state_in) {
    XXH_endianess endian_detected = (XXH_endianess) XXH_CPU_LITTLE_ENDIAN;

    if ((endian_detected == XXH_littleEndian) || XXH_FORCE_NATIVE_FORMAT)
        return XXH64_digest_endian(state_in, XXH_littleEndian);
    else
        return XXH64_digest_endian(state_in, XXH_bigEndian);
}